

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjedi_index_impl.h
# Opt level: O3

void __thiscall
json::QuickJEDITreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>::
find_smallest(QuickJEDITreeIndex<cost_model::UnitCostModelJSON<label::JSONLabel>,_node::TreeIndexJSON>
              *this,vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *cost_matrix,unsigned_long *matrix_size,
             vector<double,_std::allocator<double>_> *row_cover,
             vector<double,_std::allocator<double>_> *col_cover,double *min_val)

{
  double dVar1;
  unsigned_long uVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pvVar5;
  unsigned_long uVar6;
  unsigned_long c;
  unsigned_long uVar7;
  
  uVar2 = *matrix_size;
  if (uVar2 != 0) {
    pdVar3 = (row_cover->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = 0;
    do {
      pdVar4 = (col_cover->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pvVar5 = (cost_matrix->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar7 = 0;
      do {
        dVar1 = pdVar3[uVar6];
        if ((((dVar1 == 0.0) && (!NAN(dVar1))) && (dVar1 = pdVar4[uVar7], dVar1 == 0.0)) &&
           ((!NAN(dVar1) &&
            (dVar1 = *(double *)
                      (*(long *)&pvVar5[uVar6].super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data + uVar7 * 8), dVar1 < *min_val))))
        {
          *min_val = dVar1;
        }
        uVar7 = uVar7 + 1;
      } while (uVar2 != uVar7);
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar2);
  }
  return;
}

Assistant:

void QuickJEDITreeIndex<cost_matrixModel, TreeIndex>::find_smallest(
    std::vector<std::vector<double> >& cost_matrix,
    unsigned long& matrix_size,
    std::vector<double>& row_cover,
    std::vector<double>& col_cover,
    double& min_val)
{
  for (unsigned long r = 0; r < matrix_size; r++)
  {
    for (unsigned long c = 0; c < matrix_size; c++)
    {
      if (row_cover[r] == 0 && col_cover[c] == 0)
      {
        if (min_val > cost_matrix[r][c])
        {
          min_val = cost_matrix[r][c];
        }
      }
    }
  }
}